

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names_internal.cc
# Opt level: O2

string * __thiscall
upb::generator::MiniTableHeaderFilename_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view proto_filename,bool bootstrap)

{
  char *pcVar1;
  string_view filename;
  string_view fname;
  string base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar1 = proto_filename._M_str;
  filename._M_str = (char *)proto_filename._M_len;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  if ((int)proto_filename._M_str != 0) {
    filename._M_len = (size_t)filename._M_str;
    IsDescriptorProto(this,filename);
    pcVar1 = "upb/reflection/stage1/";
    std::__cxx11::string::assign((char *)&local_78);
  }
  fname._M_str = pcVar1;
  fname._M_len = (size_t)filename._M_str;
  StripExtension_abi_cxx11_(&local_58,this,fname);
  std::operator+(&local_38,&local_78,&local_58);
  std::operator+(__return_storage_ptr__,&local_38,".upb_minitable.h");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string MiniTableHeaderFilename(absl::string_view proto_filename,
                                    bool bootstrap) {
  std::string base;
  if (bootstrap) {
    if (IsDescriptorProto(proto_filename)) {
      base = "upb/reflection/stage1/";
    } else {
      base = "upb_generator/stage1/";
    }
  }
  return base + StripExtension(proto_filename) + ".upb_minitable.h";
}